

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUITabControl.cpp
# Opt level: O2

bool __thiscall
irr::gui::CGUITabControl::needScrollControl
          (CGUITabControl *this,s32 startIndex,bool withScrollControl,s32 *pos_rightmost)

{
  pointer ppIVar1;
  IGUITab *pIVar2;
  s32 sVar3;
  long *plVar4;
  IGUIFont *font;
  wchar_t *text;
  ulong uVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  
  bVar6 = false;
  if (startIndex < 1) {
    startIndex = 0;
  }
  plVar4 = (long *)(**(code **)(**(long **)&this->field_0x128 + 0x60))();
  if (plVar4 != (long *)0x0) {
    bVar6 = false;
    font = (IGUIFont *)(**(code **)(*plVar4 + 0x30))(plVar4,0);
    if ((font != (IGUIFont *)0x0) &&
       ((this->Tabs).m_data.
        super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (this->Tabs).m_data.
        super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>._M_impl.
        super__Vector_impl_data._M_finish)) {
      if (withScrollControl) {
        iVar8 = (this->UpButton->super_IGUIElement).AbsoluteRect.UpperLeftCorner.X + -2;
      }
      else {
        iVar8 = *(int *)&this->field_0x48;
      }
      iVar7 = *(int *)&this->field_0x40 + 2;
      uVar5 = (ulong)(uint)startIndex;
      do {
        ppIVar1 = (this->Tabs).m_data.
                  super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if ((long)(int)((ulong)((long)(this->Tabs).m_data.
                                      super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar1) >>
                       3) <= (long)uVar5) {
          if (pos_rightmost != (s32 *)0x0) {
            *pos_rightmost = iVar7;
          }
          return false;
        }
        pIVar2 = ppIVar1[uVar5];
        if (pIVar2 != (IGUITab *)0x0) {
          text = (wchar_t *)
                 (**(code **)(*(long *)&(pIVar2->super_IGUIElement).super_IEventReceiver + 0xa8))();
          sVar3 = calcTabWidth(this,font,text);
          iVar7 = iVar7 + sVar3;
        }
        uVar5 = uVar5 + 1;
      } while (iVar7 <= iVar8);
      bVar6 = true;
    }
  }
  return bVar6;
}

Assistant:

bool CGUITabControl::needScrollControl(s32 startIndex, bool withScrollControl, s32 *pos_rightmost)
{
	if (startIndex < 0)
		startIndex = 0;

	IGUISkin *skin = Environment->getSkin();
	if (!skin)
		return false;

	IGUIFont *font = skin->getFont();

	if (Tabs.empty())
		return false;

	if (!font)
		return false;

	s32 pos = AbsoluteRect.UpperLeftCorner.X + 2;
	const s32 pos_right = withScrollControl ? UpButton->getAbsolutePosition().UpperLeftCorner.X - 2 : AbsoluteRect.LowerRightCorner.X;

	for (s32 i = startIndex; i < (s32)Tabs.size(); ++i) {
		// get Text
		const wchar_t *text = 0;
		if (Tabs[i]) {
			text = Tabs[i]->getText();

			// get text length
			s32 len = calcTabWidth(font, text); // always without withScrollControl here or len would be shortened
			pos += len;
		}

		if (pos > pos_right)
			return true;
	}

	if (pos_rightmost)
		*pos_rightmost = pos;
	return false;
}